

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O2

void __thiscall
QTreeModel::beginRemoveItems(QTreeModel *this,QTreeWidgetItem *parent,int row,int count)

{
  QTreeWidgetItem *itemToBeRemoved;
  pointer ppQVar1;
  ulong uVar2;
  int index;
  int iVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  QTreeWidgetItem *local_38;
  ulong uVar5;
  
  local_38 = *(QTreeWidgetItem **)(in_FS_OFFSET + 0x28);
  uVar2 = 0;
  QTreeModel::index((QTreeModel *)&stack0xffffffffffffffb0,(char *)this,(int)parent);
  QAbstractItemModel::beginRemoveRows((QModelIndex *)this,(int)&stack0xffffffffffffffb0,row);
  if (parent == (QTreeWidgetItem *)0x0) {
    parent = this->rootItem;
  }
  uVar4 = (ulong)(uint)count;
  if (count < 1) {
    uVar4 = uVar2;
  }
  for (; uVar5 = uVar4, index = row, uVar2 < (ulong)(this->iterators).d.size; uVar2 = uVar2 + 1) {
    while (iVar3 = (int)uVar5, uVar5 = (ulong)(iVar3 - 1), iVar3 != 0) {
      itemToBeRemoved = QTreeWidgetItem::child(parent,index);
      ppQVar1 = QList<QTreeWidgetItemIterator_*>::data(&this->iterators);
      QTreeWidgetItemIteratorPrivate::ensureValidIterator((ppQVar1[uVar2]->d_ptr).d,itemToBeRemoved)
      ;
      index = index + 1;
    }
  }
  if (*(QTreeWidgetItem **)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeModel::beginRemoveItems(QTreeWidgetItem *parent, int row, int count)
{
    Q_ASSERT(row >= 0);
    Q_ASSERT(count > 0);
    beginRemoveRows(index(parent, 0), row, row + count - 1);
    if (!parent)
        parent = rootItem;
    // now update the iterators
    for (int i = 0; i < iterators.size(); ++i) {
        for (int j = 0; j < count; j++) {
            QTreeWidgetItem *c = parent->child(row + j);
            iterators[i]->d_func()->ensureValidIterator(c);
        }
    }
}